

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O1

AnimationIndex __thiscall
QSequentialAnimationGroupPrivate::indexForCurrentTime(QSequentialAnimationGroupPrivate *this)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  parameter_type pVar6;
  ulong uVar7;
  uint uVar8;
  bool bVar9;
  
  bVar9 = (this->super_QAnimationGroupPrivate).animations.d.size == 0;
  bVar4 = !bVar9;
  if (bVar9) {
    uVar8 = 0;
    uVar7 = 0;
    iVar5 = 0;
  }
  else {
    uVar7 = 0;
    uVar8 = 0;
    do {
      iVar5 = QAbstractAnimation::totalDuration
                        ((QAbstractAnimation *)
                         (this->super_QAnimationGroupPrivate).animations.d.ptr[uVar7]);
      if ((iVar5 == -1) && (iVar5 = -1, uVar7 < (ulong)(this->actualDuration).d.size)) {
        iVar5 = (this->actualDuration).d.ptr[uVar7];
      }
      if (iVar5 == -1) goto LAB_003b9e45;
      uVar1 = iVar5 + uVar8;
      uVar2 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.currentTime;
      if (((int)uVar2 < (int)uVar1) ||
         ((uVar2 == uVar1 &&
          (pVar6 = QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
                   ::value(&(this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
                            direction), pVar6 == Backward)))) goto LAB_003b9e45;
      uVar7 = uVar7 + 1;
      uVar3 = (this->super_QAnimationGroupPrivate).animations.d.size;
      bVar4 = uVar7 < uVar3;
      uVar8 = uVar1;
    } while (uVar7 < uVar3);
    uVar7 = 0;
  }
LAB_003b9e45:
  if (!bVar4) {
    uVar8 = uVar8 - iVar5;
    uVar7 = (this->super_QAnimationGroupPrivate).animations.d.size + 0xffffffff;
  }
  return (AnimationIndex)(uVar7 & 0xffffffff | (ulong)uVar8 << 0x20);
}

Assistant:

QSequentialAnimationGroupPrivate::AnimationIndex QSequentialAnimationGroupPrivate::indexForCurrentTime() const
{
    Q_ASSERT(!animations.isEmpty());

    AnimationIndex ret;
    int duration = 0;

    for (int i = 0; i < animations.size(); ++i) {
        duration = animationActualTotalDuration(i);

        // 'animation' is the current animation if one of these reasons is true:
        // 1. it's duration is undefined
        // 2. it ends after msecs
        // 3. it is the last animation (this can happen in case there is at least 1 uncontrolled animation)
        // 4. it ends exactly in msecs and the direction is backwards
        if (duration == -1 || currentTime < (ret.timeOffset + duration)
            || (currentTime == (ret.timeOffset + duration) && direction == QAbstractAnimation::Backward)) {
            ret.index = i;
            return ret;
        }

        // 'animation' has a non-null defined duration and is not the one at time 'msecs'.
        ret.timeOffset += duration;
    }

    // this can only happen when one of those conditions is true:
    // 1. the duration of the group is undefined and we passed its actual duration
    // 2. there are only 0-duration animations in the group
    ret.timeOffset -= duration;
    ret.index = animations.size() - 1;
    return ret;
}